

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O0

UChar * __thiscall
icu_63::RelativeDateFormat::getStringForDay
          (RelativeDateFormat *this,int32_t day,int32_t *len,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int n;
  UErrorCode *status_local;
  int32_t *len_local;
  int32_t day_local;
  RelativeDateFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    iVar2 = day + 2;
    if ((((iVar2 < 0) || (this->fDatesLen <= iVar2)) || (this->fDates[iVar2].offset != day)) ||
       (this->fDates[iVar2].string == (UChar *)0x0)) {
      this_local = (RelativeDateFormat *)0x0;
    }
    else {
      *len = this->fDates[iVar2].len;
      this_local = (RelativeDateFormat *)this->fDates[iVar2].string;
    }
  }
  else {
    this_local = (RelativeDateFormat *)0x0;
  }
  return (UChar *)this_local;
}

Assistant:

const UChar *RelativeDateFormat::getStringForDay(int32_t day, int32_t &len, UErrorCode &status) const {
    if(U_FAILURE(status)) {
        return NULL;
    }

    // Is it inside the resource bundle's range?
    int n = day + UDAT_DIRECTION_THIS;
    if (n >= 0 && n < fDatesLen) {
        if (fDates[n].offset == day && fDates[n].string != NULL) {
            len = fDates[n].len;
            return fDates[n].string;
        }
    }
    return NULL;  // not found.
}